

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O2

int __thiscall
CGraphicsBackend_SDL_OpenGL::Init
          (CGraphicsBackend_SDL_OpenGL *this,char *pName,int *pScreen,int *pWindowWidth,
          int *pWindowHeight,int *pScreenWidth,int *pScreenHeight,int FsaaSamples,int Flags,
          int *pDesktopWidth,int *pDesktopHeight)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  SDL_Window *pSVar6;
  SDL_GLContext pvVar7;
  CCommandProcessor_SDL_OpenGL *this_00;
  char *fmt;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  CInitCommand CmdOpenGL;
  CInitCommand local_a0;
  CCommandBuffer CmdBuffer;
  SDL_version Linked;
  SDL_Rect ScreenPos;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = SDL_WasInit();
  if (iVar2 == 0) {
    iVar2 = SDL_InitSubSystem();
    if (-1 < iVar2) goto LAB_00115f7a;
    uVar5 = SDL_GetError();
    fmt = "unable to init SDL video: %s";
  }
  else {
LAB_00115f7a:
    iVar2 = SDL_GetNumVideoDisplays();
    this->m_NumScreens = iVar2;
    if (iVar2 < 1) {
      uVar5 = SDL_GetError();
      fmt = "unable to retrieve number of screens: %s";
    }
    else {
      iVar9 = *pScreen;
      iVar4 = iVar2 + -1;
      if (iVar9 < iVar2 + -1) {
        iVar4 = iVar9;
      }
      iVar2 = 0;
      if (-1 < iVar9) {
        iVar2 = iVar4;
      }
      *pScreen = iVar2;
      iVar2 = SDL_GetDisplayBounds(iVar2,&ScreenPos);
      if (iVar2 == 0) {
        iVar2 = (*(this->super_CGraphicsBackend_Threaded).super_IGraphicsBackend.
                  _vptr_IGraphicsBackend[0xd])
                          (this,(ulong)(uint)*pScreen,pDesktopWidth,pDesktopHeight);
        if ((char)iVar2 == '\0') {
          uVar5 = SDL_GetError();
          fmt = "unable to get desktop resolution: %s";
        }
        else {
          if ((*pWindowWidth == 0) || (*pWindowHeight == 0)) {
            *pWindowWidth = *pDesktopWidth;
            *pWindowHeight = *pDesktopHeight;
          }
          if ((Flags & 0x10U) != 0) {
            SDL_SetHint("SDL_VIDEO_X11_XRANDR","1");
          }
          SDL_GL_SetAttribute(5,1);
          SDL_GL_SetAttribute(0xd,FsaaSamples != 0);
          SDL_GL_SetAttribute(0xe,FsaaSamples);
          iVar2 = *pWindowWidth;
          if ((Flags & 1U) == 0) {
            iVar4 = 0;
            iVar9 = *pWindowHeight;
            iVar3 = *pDesktopWidth - iVar2;
            if ((iVar3 == 0 || *pDesktopWidth < iVar2) ||
               (iVar8 = *pDesktopHeight - iVar9, iVar8 == 0 || *pDesktopHeight < iVar9)) {
              iVar8 = 0;
            }
            else {
              iVar4 = iVar3 / 2;
              iVar8 = iVar8 / 2;
            }
          }
          else {
            iVar9 = *pWindowHeight;
            iVar4 = 0;
            iVar8 = 0;
          }
          pSVar6 = (SDL_Window *)
                   SDL_CreateWindow(pName,iVar4 + ScreenPos.x,iVar8 + ScreenPos.y,iVar2,iVar9,
                                    (Flags & 1U) +
                                    ((Flags & 8U) * 2 + (Flags & 4U) * 8 | (Flags & 0x20U) << 8) + 2
                                   );
          this->m_pWindow = pSVar6;
          if (pSVar6 == (SDL_Window *)0x0) {
            uVar5 = SDL_GetError();
            fmt = "unable to create window: %s";
          }
          else {
            SDL_GetWindowSize(pSVar6,pWindowWidth,pWindowHeight);
            pvVar7 = (SDL_GLContext)SDL_GL_CreateContext(this->m_pWindow);
            this->m_GLContext = pvVar7;
            if (pvVar7 != (SDL_GLContext)0x0) {
              SDL_GL_GetDrawableSize(this->m_pWindow,pScreenWidth,pScreenHeight);
              SDL_GL_SetSwapInterval((uint)Flags >> 1 & 1);
              SDL_GL_MakeCurrent(0,0);
              SDL_GetVersion(&Linked);
              dbg_msg("sdl","SDL version %d.%d.%d (dll = %d.%d.%d)",2,0,0x14,(ulong)Linked.major,
                      (ulong)Linked.minor,(ulong)Linked.patch);
              this_00 = (CCommandProcessor_SDL_OpenGL *)operator_new(0x20038);
              CCommandProcessor_SDL_OpenGL::CCommandProcessor_SDL_OpenGL(this_00);
              this->m_pProcessor = (ICommandProcessor *)this_00;
              CGraphicsBackend_Threaded::StartProcessor
                        (&this->super_CGraphicsBackend_Threaded,(ICommandProcessor *)this_00);
              CCommandBuffer::CCommandBuffer(&CmdBuffer,0x400,0x200);
              local_a0.super_CCommand.m_Cmd = 20000;
              local_a0.super_CCommand.m_pNext = (CCommand *)0x0;
              local_a0.m_pWindow = this->m_pWindow;
              local_a0.m_GLContext = this->m_GLContext;
              CCommandBuffer::AddCommand<CCommandProcessorFragment_SDL::CInitCommand>
                        (&CmdBuffer,&local_a0);
              CmdOpenGL.super_CCommand.m_Cmd = 10000;
              CmdOpenGL.super_CCommand.m_pNext = (CCommand *)0x0;
              CmdOpenGL.m_pTextureMemoryUsage = &this->m_TextureMemoryUsage;
              CmdOpenGL.m_pTextureArraySize = &this->m_TextureArraySize;
              CCommandBuffer::AddCommand<CCommandProcessorFragment_OpenGL::CInitCommand>
                        (&CmdBuffer,&CmdOpenGL);
              (*(this->super_CGraphicsBackend_Threaded).super_IGraphicsBackend.
                _vptr_IGraphicsBackend[0x11])(this,&CmdBuffer);
              (*(this->super_CGraphicsBackend_Threaded).super_IGraphicsBackend.
                _vptr_IGraphicsBackend[0x13])(this);
              CCommandBuffer::~CCommandBuffer(&CmdBuffer);
              iVar2 = 0;
              goto LAB_001162d2;
            }
            uVar5 = SDL_GetError();
            fmt = "unable to create OpenGL context: %s";
          }
        }
      }
      else {
        uVar5 = SDL_GetError();
        fmt = "unable to retrieve screen information: %s";
      }
    }
  }
  dbg_msg("gfx",fmt,uVar5);
  iVar2 = -1;
LAB_001162d2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CGraphicsBackend_SDL_OpenGL::Init(const char *pName, int *pScreen, int *pWindowWidth, int *pWindowHeight, int* pScreenWidth, int* pScreenHeight, int FsaaSamples, int Flags, int *pDesktopWidth, int *pDesktopHeight)
{
	if(!SDL_WasInit(SDL_INIT_VIDEO))
	{
		if(SDL_InitSubSystem(SDL_INIT_VIDEO) < 0)
		{
			dbg_msg("gfx", "unable to init SDL video: %s", SDL_GetError());
			return -1;
		}
	}

	// set screen
	SDL_Rect ScreenPos;
	m_NumScreens = SDL_GetNumVideoDisplays();
	if(m_NumScreens > 0)
	{
		*pScreen = clamp(*pScreen, 0, m_NumScreens-1);
		if(SDL_GetDisplayBounds(*pScreen, &ScreenPos) != 0)
		{
			dbg_msg("gfx", "unable to retrieve screen information: %s", SDL_GetError());
			return -1;
		}
	}
	else
	{
		dbg_msg("gfx", "unable to retrieve number of screens: %s", SDL_GetError());
		return -1;
	}

	// store desktop resolution for settings reset button
	if(!GetDesktopResolution(*pScreen, pDesktopWidth, pDesktopHeight))
	{
		dbg_msg("gfx", "unable to get desktop resolution: %s", SDL_GetError());
		return -1;
	}

	// use desktop resolution as default resolution
	if (*pWindowWidth == 0 || *pWindowHeight == 0)
	{
		*pWindowWidth = *pDesktopWidth;
		*pWindowHeight = *pDesktopHeight;
	}

	// set flags
	int SdlFlags = SDL_WINDOW_OPENGL;
	if(Flags&IGraphicsBackend::INITFLAG_HIGHDPI)
		SdlFlags |= SDL_WINDOW_ALLOW_HIGHDPI;
	if(Flags&IGraphicsBackend::INITFLAG_RESIZABLE)
		SdlFlags |= SDL_WINDOW_RESIZABLE;
	if(Flags&IGraphicsBackend::INITFLAG_BORDERLESS)
		SdlFlags |= SDL_WINDOW_BORDERLESS;
	if(Flags&IGraphicsBackend::INITFLAG_FULLSCREEN)
#if defined(CONF_PLATFORM_MACOSX)	// Todo SDL: remove this when fixed (game freezes when losing focus in fullscreen)
	{
		SdlFlags |= SDL_WINDOW_FULLSCREEN_DESKTOP;	// always use "fake" fullscreen
		*pWindowWidth = *pDesktopWidth;
		*pWindowHeight = *pDesktopHeight;
	}
#else
		SdlFlags |= SDL_WINDOW_FULLSCREEN;
#endif

	if(Flags&IGraphicsBackend::INITFLAG_X11XRANDR)
		SDL_SetHint(SDL_HINT_VIDEO_X11_XRANDR, "1");

	// set gl attributes
	SDL_GL_SetAttribute(SDL_GL_DOUBLEBUFFER, 1);
	if(FsaaSamples)
	{
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLEBUFFERS, 1);
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLESAMPLES, FsaaSamples);
	}
	else
	{
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLEBUFFERS, 0);
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLESAMPLES, 0);
	}

	// calculate centered position in windowed mode
	int OffsetX = 0;
	int OffsetY = 0;
	if(!(Flags&IGraphicsBackend::INITFLAG_FULLSCREEN) && *pDesktopWidth > *pWindowWidth && *pDesktopHeight > *pWindowHeight)
	{
		OffsetX = (*pDesktopWidth - *pWindowWidth) / 2;
		OffsetY = (*pDesktopHeight - *pWindowHeight) / 2;
	}

	// create window
	m_pWindow = SDL_CreateWindow(pName, ScreenPos.x+OffsetX, ScreenPos.y+OffsetY, *pWindowWidth, *pWindowHeight, SdlFlags);
	if(m_pWindow == NULL)
	{
		dbg_msg("gfx", "unable to create window: %s", SDL_GetError());
		return -1;
	}

	SDL_GetWindowSize(m_pWindow, pWindowWidth, pWindowHeight);

	// create gl context
	m_GLContext = SDL_GL_CreateContext(m_pWindow);
	if(m_GLContext == NULL)
	{
		dbg_msg("gfx", "unable to create OpenGL context: %s", SDL_GetError());
		return -1;
	}

	SDL_GL_GetDrawableSize(m_pWindow, pScreenWidth, pScreenHeight); // drawable size may differ in high dpi mode

	#if defined(CONF_FAMILY_WINDOWS)
		glTexImage3DInternal = (PFNGLTEXIMAGE3DPROC) wglGetProcAddress("glTexImage3D");
		if(glTexImage3DInternal == 0)
		{
			dbg_msg("gfx", "glTexImage3D not supported");
			return -1;
		}
	#endif

	SDL_GL_SetSwapInterval(Flags&IGraphicsBackend::INITFLAG_VSYNC ? 1 : 0);

	SDL_GL_MakeCurrent(NULL, NULL);

	// print sdl version
	SDL_version Compiled;
	SDL_version Linked;

	SDL_VERSION(&Compiled);
	SDL_GetVersion(&Linked);
	dbg_msg("sdl", "SDL version %d.%d.%d (dll = %d.%d.%d)", Compiled.major, Compiled.minor, Compiled.patch, Linked.major, Linked.minor, Linked.patch);

	// start the command processor
	m_pProcessor = new CCommandProcessor_SDL_OpenGL;
	StartProcessor(m_pProcessor);

	// issue init commands for OpenGL and SDL
	CCommandBuffer CmdBuffer(1024, 512);
	CCommandProcessorFragment_SDL::CInitCommand CmdSDL;
	CmdSDL.m_pWindow = m_pWindow;
	CmdSDL.m_GLContext = m_GLContext;
	CmdBuffer.AddCommand(CmdSDL);
	CCommandProcessorFragment_OpenGL::CInitCommand CmdOpenGL;
	CmdOpenGL.m_pTextureMemoryUsage = &m_TextureMemoryUsage;
	CmdOpenGL.m_pTextureArraySize = &m_TextureArraySize;
	CmdBuffer.AddCommand(CmdOpenGL);
	RunBuffer(&CmdBuffer);
	WaitForIdle();

	return 0;
}